

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCCof.c
# Opt level: O2

void Gia_ManCofExtendSolver(Ccf_Man_t *p)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int local_50;
  uint local_4c;
  uint local_48;
  int local_44;
  sat_solver *local_40;
  Ccf_Man_t *local_38;
  
  iVar2 = sat_solver_nvars(p->pSat);
  iVar7 = iVar2 * 2;
  local_38 = p;
  do {
    iVar3 = p->pFrames->nObjs;
    if (iVar3 <= iVar2) {
      sat_solver_setnvars(p->pSat,iVar3);
      return;
    }
    pGVar4 = Gia_ManObj(p->pFrames,iVar2);
    uVar1 = *(ulong *)pGVar4;
    uVar6 = (uint)uVar1;
    if ((~uVar6 & 0x1fffffff) != 0 && -1 < (int)uVar6) {
      local_40 = p->pSat;
      uVar6 = iVar7 + (uint)((uVar6 >> 0x1d & 1) != 0) + (uVar6 & 0x1fffffff) * -2;
      local_50 = iVar7 + 1;
      local_4c = uVar6;
      local_44 = iVar2;
      iVar2 = sat_solver_addclause(local_40,&local_50,(lit *)&local_48);
      if (iVar2 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x196,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)");
      }
      uVar5 = iVar7 + (uint)((uVar1 >> 0x3d & 1) != 0) + ((uint)(uVar1 >> 0x20) & 0x1fffffff) * -2;
      local_50 = iVar7 + 1;
      local_4c = uVar5;
      iVar2 = sat_solver_addclause(local_40,&local_50,(lit *)&local_48);
      if (iVar2 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x19b,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)");
      }
      local_4c = uVar6 ^ 1;
      local_48 = uVar5 ^ 1;
      local_50 = iVar7;
      iVar3 = sat_solver_addclause(local_40,&local_50,&local_44);
      p = local_38;
      iVar2 = local_44;
      if (iVar3 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x1a1,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)");
      }
    }
    iVar2 = iVar2 + 1;
    iVar7 = iVar7 + 2;
  } while( true );
}

Assistant:

void Gia_ManCofExtendSolver( Ccf_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    // add SAT clauses
    for ( i = sat_solver_nvars(p->pSat); i < Gia_ManObjNum(p->pFrames); i++ )
    {
        pObj = Gia_ManObj( p->pFrames, i );
        if ( Gia_ObjIsAnd(pObj) )
            sat_solver_add_and( p->pSat, i, 
                Gia_ObjFaninId0(pObj, i), 
                Gia_ObjFaninId1(pObj, i), 
                Gia_ObjFaninC0(pObj), 
                Gia_ObjFaninC1(pObj), 0 ); 
    }
    sat_solver_setnvars( p->pSat, Gia_ManObjNum(p->pFrames) );
}